

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O2

internals * pybind11::detail::get_internals(void)

{
  internals **ppiVar1;
  bool bVar2;
  int iVar3;
  internals *piVar4;
  long lVar5;
  Py_tss_t *pPVar6;
  PyTypeObject *pPVar7;
  PyObject *pPVar8;
  handle local_58;
  gil_scoped_acquire_local gil;
  handle local_48;
  handle builtins;
  item_accessor local_38;
  char *id;
  
  if ((get_internals_pp()::internals_pp != (internals **)0x0) &&
     (*get_internals_pp()::internals_pp != (internals *)0x0)) {
    return *get_internals_pp()::internals_pp;
  }
  gil.state = PyGILState_Ensure();
  id = "__pybind11_internals_v3__";
  builtins.m_ptr = (PyObject *)PyEval_GetBuiltins();
  bVar2 = object_api<pybind11::handle>::contains<char_const*const&>
                    ((object_api<pybind11::handle> *)&builtins,&id);
  if (bVar2) {
    object_api<pybind11::handle>::operator[]
              (&local_38,(object_api<pybind11::handle> *)&builtins,"__pybind11_internals_v3__");
    accessor::operator_cast_to_object((accessor *)&local_58);
    if (local_58.m_ptr == (PyObject *)0x0) {
      object::~object((object *)&local_58);
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_38);
    }
    else {
      pPVar7 = (local_58.m_ptr)->ob_type;
      object::~object((object *)&local_58);
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_38);
      if (pPVar7 == (PyTypeObject *)&PyCapsule_Type) {
        object_api<pybind11::handle>::operator[]
                  (&local_38,(object_api<pybind11::handle> *)&builtins,"__pybind11_internals_v3__");
        accessor::operator_cast_to_object((accessor *)&local_48);
        local_58.m_ptr = local_48.m_ptr;
        local_48.m_ptr = (PyObject *)0x0;
        get_internals_pp()::internals_pp =
             capsule::operator_cast_to_internals__((capsule *)&local_58);
        object::~object((object *)&local_58);
        object::~object((object *)&local_48);
        accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_38);
        goto LAB_0010b1fc;
      }
    }
  }
  if (get_internals_pp()::internals_pp == (internals **)0x0) {
    get_internals_pp()::internals_pp = (internals **)operator_new(8);
    *get_internals_pp()::internals_pp = (internals *)0x0;
  }
  ppiVar1 = get_internals_pp()::internals_pp;
  piVar4 = (internals *)operator_new(0x1d8);
  memset(piVar4,0,0x1d8);
  internals::internals(piVar4);
  *ppiVar1 = piVar4;
  PyEval_InitThreads();
  lVar5 = PyThreadState_Get();
  pPVar6 = (Py_tss_t *)PyThread_tss_alloc();
  (*ppiVar1)->tstate = pPVar6;
  if (((*ppiVar1)->tstate == (Py_tss_t *)0x0) || (iVar3 = PyThread_tss_create(), iVar3 != 0)) {
    pybind11_fail("get_internals: could not successfully initialize the TSS key!");
  }
  PyThread_tss_set((*ppiVar1)->tstate,lVar5);
  (*ppiVar1)->istate = *(PyInterpreterState **)(lVar5 + 0x10);
  capsule::capsule((capsule *)&local_58,get_internals_pp()::internals_pp,(char *)0x0,
                   (_func_void_PyObject_ptr *)0x0);
  object_api<pybind11::handle>::operator[]
            (&local_38,(object_api<pybind11::handle> *)&builtins,"__pybind11_internals_v3__");
  accessor<pybind11::detail::accessor_policies::generic_item>::operator=
            (&local_38,(capsule *)&local_58);
  accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_38);
  object::~object((object *)&local_58);
  local_38._0_8_ = get_internals()::{lambda(std::__exception_ptr::exception_ptr)#1}::exception_ptr_;
  std::
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  ::push_front(&(*ppiVar1)->registered_exception_translators,(_func_void_exception_ptr **)&local_38)
  ;
  pPVar7 = make_static_property_type();
  (*ppiVar1)->static_property_type = pPVar7;
  pPVar7 = make_default_metaclass();
  (*ppiVar1)->default_metaclass = pPVar7;
  pPVar8 = make_object_base_type((*ppiVar1)->default_metaclass);
  (*ppiVar1)->instance_base = pPVar8;
LAB_0010b1fc:
  piVar4 = *get_internals_pp()::internals_pp;
  get_internals::gil_scoped_acquire_local::~gil_scoped_acquire_local(&gil);
  return piVar4;
}

Assistant:

PYBIND11_NOINLINE inline internals &get_internals() {
    auto **&internals_pp = get_internals_pp();
    if (internals_pp && *internals_pp)
        return **internals_pp;

    // Ensure that the GIL is held since we will need to make Python calls.
    // Cannot use py::gil_scoped_acquire here since that constructor calls get_internals.
    struct gil_scoped_acquire_local {
        gil_scoped_acquire_local() : state (PyGILState_Ensure()) {}
        ~gil_scoped_acquire_local() { PyGILState_Release(state); }
        const PyGILState_STATE state;
    } gil;

    constexpr auto *id = PYBIND11_INTERNALS_ID;
    auto builtins = handle(PyEval_GetBuiltins());
    if (builtins.contains(id) && isinstance<capsule>(builtins[id])) {
        internals_pp = static_cast<internals **>(capsule(builtins[id]));

        // We loaded builtins through python's builtins, which means that our `error_already_set`
        // and `builtin_exception` may be different local classes than the ones set up in the
        // initial exception translator, below, so add another for our local exception classes.
        //
        // libstdc++ doesn't require this (types there are identified only by name)
#if !defined(__GLIBCXX__)
        (*internals_pp)->registered_exception_translators.push_front(
            [](std::exception_ptr p) -> void {
                try {
                    if (p) std::rethrow_exception(p);
                } catch (error_already_set &e)       { e.restore();   return;
                } catch (const builtin_exception &e) { e.set_error(); return;
                }
            }
        );
#endif
    } else {
        if (!internals_pp) internals_pp = new internals*();
        auto *&internals_ptr = *internals_pp;
        internals_ptr = new internals();
#if defined(WITH_THREAD)
        PyEval_InitThreads();
        PyThreadState *tstate = PyThreadState_Get();
        #if PY_VERSION_HEX >= 0x03070000
            internals_ptr->tstate = PyThread_tss_alloc();
            if (!internals_ptr->tstate || PyThread_tss_create(internals_ptr->tstate))
                pybind11_fail("get_internals: could not successfully initialize the TSS key!");
            PyThread_tss_set(internals_ptr->tstate, tstate);
        #else
            internals_ptr->tstate = PyThread_create_key();
            if (internals_ptr->tstate == -1)
                pybind11_fail("get_internals: could not successfully initialize the TLS key!");
            PyThread_set_key_value(internals_ptr->tstate, tstate);
        #endif
        internals_ptr->istate = tstate->interp;
#endif
        builtins[id] = capsule(internals_pp);
        internals_ptr->registered_exception_translators.push_front(
            [](std::exception_ptr p) -> void {
                try {
                    if (p) std::rethrow_exception(p);
                } catch (error_already_set &e)           { e.restore();                                    return;
                } catch (const builtin_exception &e)     { e.set_error();                                  return;
                } catch (const std::bad_alloc &e)        { PyErr_SetString(PyExc_MemoryError,   e.what()); return;
                } catch (const std::domain_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::invalid_argument &e) { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::length_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::out_of_range &e)     { PyErr_SetString(PyExc_IndexError,    e.what()); return;
                } catch (const std::range_error &e)      { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::exception &e)        { PyErr_SetString(PyExc_RuntimeError,  e.what()); return;
                } catch (...) {
                    PyErr_SetString(PyExc_RuntimeError, "Caught an unknown exception!");
                    return;
                }
            }
        );
        internals_ptr->static_property_type = make_static_property_type();
        internals_ptr->default_metaclass = make_default_metaclass();
        internals_ptr->instance_base = make_object_base_type(internals_ptr->default_metaclass);
    }
    return **internals_pp;
}